

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::compute_quant_table(jpeg_encoder *this,int32 *pDst,int16 *pSrc)

{
  int local_44;
  int local_40;
  int local_3c;
  int local_28;
  int32 j;
  int i;
  int32 q;
  int16 *pSrc_local;
  int32 *pDst_local;
  jpeg_encoder *this_local;
  
  if ((this->m_params).m_quality < 0x32) {
    j = (int32)(5000 / (long)(this->m_params).m_quality);
  }
  else {
    j = (this->m_params).m_quality * -2 + 200;
  }
  _i = pSrc;
  pSrc_local = (int16 *)pDst;
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    local_40 = (int)(((long)(*_i * j) + 0x32) / 100);
    local_3c = local_40;
    if (local_40 < 2) {
      local_3c = 1;
    }
    if (local_3c < 0xff) {
      if (local_40 < 2) {
        local_40 = 1;
      }
      local_44 = local_40;
    }
    else {
      local_44 = 0xff;
    }
    *(int *)pSrc_local = local_44;
    _i = _i + 1;
    pSrc_local = pSrc_local + 2;
  }
  return;
}

Assistant:

void jpeg_encoder::compute_quant_table(int32 *pDst, int16 *pSrc)
{
  int32 q;
  if (m_params.m_quality < 50)
    q = 5000 / m_params.m_quality;
  else
    q = 200 - m_params.m_quality * 2;
  for (int i = 0; i < 64; i++)
  {
    int32 j = *pSrc++; j = (j * q + 50L) / 100L;
    *pDst++ = JPGE_MIN(JPGE_MAX(j, 1), 255);
  }
}